

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O1

bool __thiscall lunasvg::Length::parse(Length *this,string_view input,LengthNegativeMode mode)

{
  byte bVar1;
  bool bVar2;
  LengthUnits LVar3;
  long lVar4;
  float value;
  string_view local_38;
  float local_24;
  
  local_38._M_str = input._M_str;
  local_38._M_len = input._M_len;
  local_24 = 0.0;
  stripLeadingAndTrailingSpaces(&local_38);
  bVar2 = parseNumber<float>(&local_38,&local_24);
  if (!bVar2) {
    return false;
  }
  if ((mode == Forbid) && (local_24 < 0.0)) {
    return false;
  }
  if (local_38._M_len == 0) {
    this->m_value = local_24;
    this->m_units = None;
    return true;
  }
  bVar1 = *local_38._M_str;
  if (bVar1 < 0x69) {
    if (bVar1 == 0x25) {
      this->m_value = local_24;
      this->m_units = Percent;
      lVar4 = local_38._M_len - 1;
      goto LAB_0011f839;
    }
    if (bVar1 == 99) {
      if (local_38._M_len == 1) {
        return false;
      }
      if (local_38._M_str[1] != 0x6d) {
        return false;
      }
      local_24 = (local_24 * 96.0) / 2.54;
      goto LAB_0011f824;
    }
    if (bVar1 != 0x65) {
      return false;
    }
    if (local_38._M_len == 1) {
      return false;
    }
    if (local_38._M_str[1] == 0x6d) {
      LVar3 = Em;
    }
    else {
      if (local_38._M_str[1] != 0x78) {
        return false;
      }
      LVar3 = Ex;
    }
    this->m_units = LVar3;
    this->m_value = local_24;
  }
  else {
    if (bVar1 == 0x69) {
      if (local_38._M_len == 1) {
        return false;
      }
      if (local_38._M_str[1] != 0x6e) {
        return false;
      }
      local_24 = local_24 * 96.0;
    }
    else if (bVar1 == 0x6d) {
      if (local_38._M_len == 1) {
        return false;
      }
      if (local_38._M_str[1] != 0x6d) {
        return false;
      }
      local_24 = (local_24 * 96.0) / 25.4;
    }
    else {
      if (bVar1 != 0x70) {
        return false;
      }
      if (local_38._M_len == 1) {
        return false;
      }
      bVar1 = local_38._M_str[1];
      if (bVar1 != 0x78) {
        if (bVar1 == 0x74) {
          local_24 = (local_24 * 96.0) / 72.0;
        }
        else {
          if (bVar1 != 99) {
            return false;
          }
          local_24 = (local_24 * 96.0) / 6.0;
        }
      }
    }
LAB_0011f824:
    this->m_value = local_24;
    this->m_units = Px;
  }
  lVar4 = local_38._M_len - 2;
LAB_0011f839:
  return lVar4 == 0;
}

Assistant:

bool Length::parse(std::string_view input, LengthNegativeMode mode)
{
    float value = 0.f;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value))
        return false;
    if(value < 0.f && mode == LengthNegativeMode::Forbid)
        return false;
    if(input.empty()) {
        m_value = value;
        m_units = LengthUnits::None;
        return true;
    }

    constexpr auto dpi = 96.f;
    switch(input.front()) {
    case '%':
        m_value = value;
        m_units = LengthUnits::Percent;
        input.remove_prefix(1);
        break;
    case 'p':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'x')
            m_value = value;
        else if(input.front() == 'c')
            m_value = value * dpi / 6.f;
        else if(input.front() == 't')
            m_value = value * dpi / 72.f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'i':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'n')
            m_value = value * dpi;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'c':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_value = value * dpi / 2.54f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'm':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_value = value * dpi / 25.4f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'e':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_units = LengthUnits::Em;
        else if(input.front() == 'x')
            m_units = LengthUnits::Ex;
        else
            return false;
        m_value = value;
        input.remove_prefix(1);
        break;
    default:
        return false;
    }

    return input.empty();
}